

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.h
# Opt level: O0

void __thiscall InvertDatabase::get_ext_item(InvertDatabase *this,int it)

{
  element_type *peVar1;
  reference pvVar2;
  __shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var3;
  element_type *peVar4;
  __shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var5;
  element_type *peVar6;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> local_58 [2];
  shared_ptr<std::vector<int,_std::allocator<int>_>_> local_38;
  undefined1 local_28 [8];
  shared_ptr<std::vector<int,_std::allocator<int>_>_> newit;
  int supsz;
  int it_local;
  InvertDatabase *this_local;
  
  newit.super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = it;
  peVar1 = std::__shared_ptr_access<Partition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Partition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->partition);
  newit.super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ =
       Partition::partition_get_idxsup
                 (peVar1,newit.
                         super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi._4_4_);
  std::make_shared<std::vector<int,std::allocator<int>>,int&>((int *)local_28);
  peVar1 = std::__shared_ptr_access<Partition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Partition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->partition);
  std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::shared_ptr
            (&local_38,(shared_ptr<std::vector<int,_std::allocator<int>_>_> *)local_28);
  Partition::partition_read_item
            (peVar1,&local_38,
             newit.
             super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._4_4_);
  std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::~shared_ptr(&local_38);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->fidx,
                      (long)newit.
                            super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi._4_4_);
  p_Var3 = (__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::vector<std::shared_ptr<Itemset>,_std::allocator<std::shared_ptr<Itemset>_>_>::
           operator[](&this->_items,(long)*pvVar2);
  peVar4 = std::__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var3);
  Itemset::set_support
            (peVar4,(int)newit.
                         super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->fidx,
                      (long)newit.
                            super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi._4_4_);
  p_Var3 = (__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::vector<std::shared_ptr<Itemset>,_std::allocator<std::shared_ptr<Itemset>_>_>::
           operator[](&this->_items,(long)*pvVar2);
  peVar4 = std::__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var3);
  p_Var5 = (__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           Itemset::ival(peVar4);
  peVar6 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var5);
  Array::set_size(peVar6,(int)newit.
                              super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->fidx,
                      (long)newit.
                            super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi._4_4_);
  p_Var3 = (__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::vector<std::shared_ptr<Itemset>,_std::allocator<std::shared_ptr<Itemset>_>_>::
           operator[](&this->_items,(long)*pvVar2);
  peVar4 = std::__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var3);
  p_Var5 = (__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           Itemset::ival(peVar4);
  peVar6 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var5);
  std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::shared_ptr
            (local_58,(shared_ptr<std::vector<int,_std::allocator<int>_>_> *)local_28);
  Array::set_array(peVar6,local_58);
  std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::~shared_ptr(local_58);
  std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::~shared_ptr
            ((shared_ptr<std::vector<int,_std::allocator<int>_>_> *)local_28);
  return;
}

Assistant:

void get_ext_item(int it) {
        int supsz = partition->partition_get_idxsup(it);
        shared_ptr<vint> newit = make_shared<vint>(supsz);
        partition->partition_read_item(newit, it);
        _items[fidx[it]]->set_support(supsz);
        _items[fidx[it]]->ival()->set_size(supsz);
        _items[fidx[it]]->ival()->set_array(newit);
    }